

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sum_squares.c
# Opt level: O0

uint64_t aom_sum_squares_i16_c(int16_t *src,uint32_t n)

{
  int16_t v;
  uint64_t ss;
  uint32_t n_local;
  int16_t *src_local;
  
  ss = 0;
  n_local = n;
  src_local = src;
  do {
    ss = (long)((int)*src_local * (int)*src_local) + ss;
    n_local = n_local - 1;
    src_local = src_local + 1;
  } while (n_local != 0);
  return ss;
}

Assistant:

uint64_t aom_sum_squares_i16_c(const int16_t *src, uint32_t n) {
  uint64_t ss = 0;
  do {
    const int16_t v = *src++;
    ss += v * v;
  } while (--n);

  return ss;
}